

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

void __thiscall Minisat::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  vec<unsigned_int> *pvVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  vec<unsigned_int> *pvVar5;
  int iVar6;
  uint64_t uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int i;
  int local_34;
  int iVar7;
  
  if (this->n_touched != 0) {
    iVar9 = (this->subsumption_queue).end;
    iVar10 = (this->subsumption_queue).buf.sz;
    iVar12 = (this->subsumption_queue).first;
    iVar13 = 0;
    iVar7 = 0;
    if (iVar9 < iVar12) {
      iVar7 = iVar10;
    }
    iVar6 = iVar7 + (iVar9 - iVar12);
    if (iVar6 != 0 && SCARRY4(iVar7,iVar9 - iVar12) == iVar6 < 0) {
      do {
        uVar2 = (this->subsumption_queue).buf.data[(iVar12 + iVar13) % iVar10];
        puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        uVar4 = *(ulong *)(puVar3 + uVar2);
        if ((uVar4 & 3) == 0) {
          *(ulong *)(puVar3 + uVar2) = uVar4 | 2;
          iVar9 = (this->subsumption_queue).end;
          iVar10 = (this->subsumption_queue).buf.sz;
          iVar12 = (this->subsumption_queue).first;
        }
        iVar13 = iVar13 + 1;
        iVar6 = 0;
        if (iVar9 < iVar12) {
          iVar6 = iVar10;
        }
        iVar6 = (iVar9 - iVar12) + iVar6;
      } while (iVar13 < iVar6);
    }
    uVar8 = (long)iVar6 + (this->super_Solver).statistics.simpSteps;
    (this->super_Solver).statistics.simpSteps = uVar8;
    local_34 = 0;
    iVar7 = (this->touched).sz;
    if (0 < iVar7) {
      do {
        lVar11 = (long)local_34;
        if ((this->touched).data[lVar11] != '\0') {
          if ((this->occurs).dirty.data[lVar11] != '\0') {
            OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clean
                      (&this->occurs,&local_34);
            lVar11 = (long)local_34;
          }
          pvVar5 = (this->occurs).occs.data;
          pvVar1 = pvVar5 + lVar11;
          iVar9 = pvVar5[lVar11].sz;
          if (0 < iVar9) {
            lVar11 = 0;
            do {
              if (((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory
                   [pvVar1->data[lVar11]] & 3) == 0) {
                Queue<unsigned_int>::insert(&this->subsumption_queue,pvVar1->data[lVar11]);
                puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
                *(ulong *)(puVar3 + pvVar1->data[lVar11]) =
                     *(ulong *)(puVar3 + pvVar1->data[lVar11]) & 0xfffffffffffffffc | 2;
                iVar9 = pvVar1->sz;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < iVar9);
          }
          (this->touched).data[local_34] = '\0';
          uVar8 = (long)pvVar1->sz + (this->super_Solver).statistics.simpSteps;
          (this->super_Solver).statistics.simpSteps = uVar8;
          iVar7 = (this->touched).sz;
        }
        local_34 = local_34 + 1;
      } while (local_34 < iVar7);
      iVar9 = (this->subsumption_queue).end;
      iVar10 = (this->subsumption_queue).buf.sz;
      iVar12 = (this->subsumption_queue).first;
    }
    iVar13 = 0;
    iVar7 = 0;
    if (iVar9 < iVar12) {
      iVar7 = iVar10;
    }
    iVar6 = iVar7 + (iVar9 - iVar12);
    if (iVar6 != 0 && SCARRY4(iVar7,iVar9 - iVar12) == iVar6 < 0) {
      do {
        uVar2 = (this->subsumption_queue).buf.data[(iVar12 + iVar13) % iVar10];
        puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        uVar4 = *(ulong *)(puVar3 + uVar2);
        if (((uint)uVar4 & 3) == 2) {
          *(ulong *)(puVar3 + uVar2) = uVar4 & 0xfffffffffffffffc;
          iVar9 = (this->subsumption_queue).end;
          iVar10 = (this->subsumption_queue).buf.sz;
          iVar12 = (this->subsumption_queue).first;
        }
        iVar13 = iVar13 + 1;
        iVar6 = 0;
        if (iVar9 < iVar12) {
          iVar6 = iVar10;
        }
        iVar6 = iVar6 + (iVar9 - iVar12);
      } while (iVar13 < iVar6);
      uVar8 = (this->super_Solver).statistics.simpSteps;
    }
    (this->super_Solver).statistics.simpSteps = (long)iVar6 + uVar8;
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i, j;
    for (i = j = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0) ca[subsumption_queue[i]].mark(2);
    statistics.simpSteps += subsumption_queue.size();

    for (i = 0; i < touched.size(); i++)
        if (touched[i]) {
            const vec<CRef> &cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0) {
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
            statistics.simpSteps += cs.size();
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2) ca[subsumption_queue[i]].mark(0);
    statistics.simpSteps += subsumption_queue.size();

    n_touched = 0;
}